

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall gimage::Histogram::convertToImage(Histogram *this,ImageFloat *image)

{
  unsigned_long **ppuVar1;
  float ***pppfVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  
  uVar3 = sumAll(this);
  Image<float,_gimage::PixelTraits<float>_>::setSize(image,(long)this->w,(long)this->h,1);
  if (uVar3 != 0) {
    uVar5 = 0;
    uVar4 = (ulong)(uint)this->w;
    if (this->w < 1) {
      uVar4 = uVar5;
    }
    uVar6 = (ulong)(uint)this->h;
    if (this->h < 1) {
      uVar6 = uVar5;
    }
    for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      ppuVar1 = this->row;
      pppfVar2 = image->img;
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        (*pppfVar2)[uVar5][uVar7] = (float)ppuVar1[uVar5][uVar7] / (float)uVar3;
      }
    }
  }
  return;
}

Assistant:

void Histogram::convertToImage(ImageFloat &image) const
{
  float total=static_cast<float>(sumAll());

  image.setSize(w, h, 1);

  if (total > 0)
  {
    for (int k=0; k<h; k++)
    {
      for (int i=0; i<w; i++)
      {
        image.set(i, k, 0, row[k][i]/total);
      }
    }
  }
}